

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_ror_cc_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t i)

{
  byte bVar1;
  
  if ((i & 0x1f) == 0) {
    if ((i & 0xe0) != 0) {
      env->CF = x >> 0x1f;
      return x;
    }
  }
  else {
    env->CF = (uint)((x >> ((byte)((char)(i & 0x1f) - 1) & 0x1f) & 1) != 0);
    bVar1 = (byte)i & 0x1f;
    x = x >> bVar1 | x << 0x20 - bVar1;
  }
  return x;
}

Assistant:

uint32_t HELPER(ror_cc)(CPUARMState *env, uint32_t x, uint32_t i)
{
    int shift1, shift;
    shift1 = i & 0xff;
    shift = shift1 & 0x1f;
    if (shift == 0) {
        if (shift1 != 0)
            env->CF = (x >> 31) & 1;
        return x;
    } else {
        env->CF = (x >> (shift - 1)) & 1;
        return ((uint32_t)x >> shift) | (x << (32 - shift));
    }
}